

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_intel.cc
# Opt level: O0

void OPENSSL_cpuid(uint32_t *out_eax,uint32_t *out_ebx,uint32_t *out_ecx,uint32_t *out_edx,
                  uint32_t leaf)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t leaf_local;
  uint32_t *out_edx_local;
  uint32_t *out_ecx_local;
  uint32_t *out_ebx_local;
  uint32_t *out_eax_local;
  
  if (leaf == 0) {
    puVar1 = (uint32_t *)cpuid_basic_info(0);
  }
  else if (leaf == 1) {
    puVar1 = (uint32_t *)cpuid_Version_info(1);
  }
  else if (leaf == 2) {
    puVar1 = (uint32_t *)cpuid_cache_tlb_info(2);
  }
  else if (leaf == 3) {
    puVar1 = (uint32_t *)cpuid_serial_info(3);
  }
  else if (leaf == 4) {
    puVar1 = (uint32_t *)cpuid_Deterministic_Cache_Parameters_info(4);
  }
  else if (leaf == 5) {
    puVar1 = (uint32_t *)cpuid_MONITOR_MWAIT_Features_info(5);
  }
  else if (leaf == 6) {
    puVar1 = (uint32_t *)cpuid_Thermal_Power_Management_info(6);
  }
  else if (leaf == 7) {
    puVar1 = (uint32_t *)cpuid_Extended_Feature_Enumeration_info(7);
  }
  else if (leaf == 9) {
    puVar1 = (uint32_t *)cpuid_Direct_Cache_Access_info(9);
  }
  else if (leaf == 10) {
    puVar1 = (uint32_t *)cpuid_Architectural_Performance_Monitoring_info(10);
  }
  else if (leaf == 0xb) {
    puVar1 = (uint32_t *)cpuid_Extended_Topology_info(0xb);
  }
  else if (leaf == 0xd) {
    puVar1 = (uint32_t *)cpuid_Processor_Extended_States_info(0xd);
  }
  else if (leaf == 0xf) {
    puVar1 = (uint32_t *)cpuid_Quality_of_Service_info(0xf);
  }
  else if (leaf == 0x80000002) {
    puVar1 = (uint32_t *)cpuid_brand_part1_info(0x80000002);
  }
  else if (leaf == 0x80000003) {
    puVar1 = (uint32_t *)cpuid_brand_part2_info(0x80000003);
  }
  else if (leaf == 0x80000004) {
    puVar1 = (uint32_t *)cpuid_brand_part3_info(0x80000004);
  }
  else {
    puVar1 = (uint32_t *)cpuid(leaf);
  }
  uVar2 = puVar1[1];
  uVar3 = puVar1[2];
  uVar4 = puVar1[3];
  *out_eax = *puVar1;
  *out_ebx = uVar2;
  *out_ecx = uVar4;
  *out_edx = uVar3;
  return;
}

Assistant:

static void OPENSSL_cpuid(uint32_t *out_eax, uint32_t *out_ebx,
                          uint32_t *out_ecx, uint32_t *out_edx, uint32_t leaf) {
#if defined(_MSC_VER)
  int tmp[4];
  __cpuid(tmp, (int)leaf);
  *out_eax = (uint32_t)tmp[0];
  *out_ebx = (uint32_t)tmp[1];
  *out_ecx = (uint32_t)tmp[2];
  *out_edx = (uint32_t)tmp[3];
#elif defined(__pic__) && defined(OPENSSL_32_BIT)
  // Inline assembly may not clobber the PIC register. For 32-bit, this is EBX.
  // See https://gcc.gnu.org/bugzilla/show_bug.cgi?id=47602.
  __asm__ volatile(
      "xor %%ecx, %%ecx\n"
      "mov %%ebx, %%edi\n"
      "cpuid\n"
      "xchg %%edi, %%ebx\n"
      : "=a"(*out_eax), "=D"(*out_ebx), "=c"(*out_ecx), "=d"(*out_edx)
      : "a"(leaf));
#else
  __asm__ volatile(
      "xor %%ecx, %%ecx\n"
      "cpuid\n"
      : "=a"(*out_eax), "=b"(*out_ebx), "=c"(*out_ecx), "=d"(*out_edx)
      : "a"(leaf));
#endif
}